

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpSubAA(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  int iVar1;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  word *n_00;
  word *mod;
  word *mod_00;
  word *mod_01;
  
  mod_00 = *(word **)(in_RCX[3] + 0x30);
  mod = in_R8 + (long)mod_00;
  n_00 = mod + (long)mod_00;
  mod_01 = n_00 + (long)mod_00;
  iVar1 = wwCmp(in_RSI,in_RDX,*(size_t *)(in_RCX[3] + 0x30));
  if (iVar1 == 0) {
    iVar1 = wwCmp(in_RSI + (long)mod_00,in_RDX + (long)mod_00,*(size_t *)(in_RCX[3] + 0x30));
    if (iVar1 == 0) {
      return 0;
    }
    (**(code **)(in_RCX[3] + 0x70))(in_R8,in_RSI,in_RCX[3],mod_01);
    zzDoubleMod(in_RDX,in_RCX,mod_01,(size_t)mod_00);
    zzAddMod(in_RDX,in_RCX,mod_01,mod_00,(size_t)in_R8);
    zzAddMod(in_RDX,in_RCX,mod_01,mod_00,(size_t)in_R8);
    zzDoubleMod(in_RDX,in_RCX,mod_01,(size_t)mod_00);
  }
  else {
    zzSubMod(mod_01,mod_00,in_R8,mod,(size_t)n_00);
    zzAddMod(in_RDX,in_RCX,mod_01,mod_00,(size_t)in_R8);
  }
  (**(code **)(in_RCX[3] + 0x80))(mod,mod,in_R8,in_RCX[3],mod_01);
  (**(code **)(in_RCX[3] + 0x70))(in_R8,mod,in_RCX[3],mod_01);
  zzSubMod(mod_01,mod_00,in_R8,mod,(size_t)n_00);
  zzSubMod(mod_01,mod_00,in_R8,mod,(size_t)n_00);
  zzSubMod(mod_01,mod_00,in_R8,mod,(size_t)n_00);
  (**(code **)(in_RCX[3] + 0x68))(mod,mod,n_00,in_RCX[3],mod_01);
  zzSubMod(mod_01,mod_00,in_R8,mod,(size_t)n_00);
  wwCopy(in_RDI,in_R8,*(size_t *)(in_RCX[3] + 0x30));
  wwCopy(in_RDI + (long)mod_00,mod,*(size_t *)(in_RCX[3] + 0x30));
  return 1;
}

Assistant:

bool_t ecpSubAA(word c[], const word a[], const word b[], const ec_o* ec,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	stack = t3 + n;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(ecpSeemsOnA(b, ec));
	// xa != xb?
	if (qrCmp(ecX(a), ecX(b), ec->f) != 0)
	{
		// t1 <- xa - xb
		zmSub(t1, ecX(a), ecX(b), ec->f);
		// t2 <- ya + yb
		zmAdd(t2, ecY(a, n), ecY(b, n), ec->f);
	}
	else
	{
		// ya == yb => a == b => a - b == O
		if (qrCmp(ecY(a, n), ecY(b, n), ec->f) == 0)
			return FALSE;
		// здесь должно быть a == -b => a - b = 2a
		// t2 <- 3 xa^2 + A
		qrSqr(t1, ecX(a), ec->f, stack);
		gfpDouble(t2, t1, ec->f);
		zmAdd(t2, t2, t1, ec->f);
		zmAdd(t2, t2, ec->A, ec->f);
		// t1 <- 2 ya
		gfpDouble(t1, ecY(a, n), ec->f);
	}
	// t2 <- t2 / t1 = \lambda
	qrDiv(t2, t2, t1, ec->f, stack);
	// t1 <- \lambda^2 - xa - xb = xc
	qrSqr(t1, t2, ec->f, stack);
	zmSub(t1, t1, ecX(a), ec->f);
	zmSub(t1, t1, ecX(b), ec->f);
	// t3 <- xa - xc
	zmSub(t3, ecX(a), t1, ec->f);
	// t2 <- \lambda(xa - xc) - ya
	qrMul(t2, t2, t3, ec->f, stack);
	zmSub(t2, t2, ecY(a, n), ec->f);
	// выгрузить результат
	qrCopy(ecX(c), t1, ec->f);
	qrCopy(ecY(c, n), t2, ec->f);
	return TRUE;
}